

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O0

int evutil_parse_sockaddr_port(char *ip_as_string,sockaddr *out,int *outlen)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  undefined2 local_10c;
  uint16_t uStack_10a;
  undefined4 uStack_108;
  sockaddr_in sin;
  sockaddr_in6 sin6;
  size_t len;
  char *pcStack_d0;
  int is_ipv6;
  char *port_part;
  char *addr_part;
  char *cp;
  char buf [128];
  int local_2c;
  int port;
  int *outlen_local;
  sockaddr *out_local;
  char *ip_as_string_local;
  
  pcStack_d0 = strchr(ip_as_string,0x3a);
  if (*ip_as_string == '[') {
    pcStack_d0 = strchr(ip_as_string,0x5d);
    if (pcStack_d0 == (char *)0x0) {
      return -1;
    }
    sin6._20_8_ = (long)pcStack_d0 - (long)(ip_as_string + 1);
    if (0x7f < (ulong)sin6._20_8_) {
      return -1;
    }
    memcpy(&cp,ip_as_string + 1,sin6._20_8_);
    buf[sin6._20_8_ + -8] = '\0';
    port_part = (char *)&cp;
    if (pcStack_d0[1] == ':') {
      pcStack_d0 = pcStack_d0 + 2;
    }
    else {
      pcStack_d0 = (char *)0x0;
    }
    bVar1 = true;
  }
  else {
    port_part = ip_as_string;
    if ((pcStack_d0 == (char *)0x0) || (pcVar3 = strchr(pcStack_d0 + 1,0x3a), pcVar3 == (char *)0x0)
       ) {
      if (pcStack_d0 == (char *)0x0) {
        pcStack_d0 = (char *)0x0;
      }
      else {
        if (0x7f < (long)pcStack_d0 - (long)ip_as_string) {
          return -1;
        }
        memcpy(&cp,ip_as_string,(long)pcStack_d0 - (long)ip_as_string);
        pcStack_d0[(long)(buf + (-8 - (long)ip_as_string))] = '\0';
        port_part = (char *)&cp;
        pcStack_d0 = pcStack_d0 + 1;
      }
      bVar1 = false;
    }
    else {
      bVar1 = true;
      pcStack_d0 = (char *)0x0;
    }
  }
  if (pcStack_d0 == (char *)0x0) {
    local_2c = 0;
  }
  else {
    local_2c = atoi(pcStack_d0);
    if ((local_2c < 1) || (0xffff < local_2c)) {
      return -1;
    }
  }
  if (port_part == (char *)0x0) {
    ip_as_string_local._4_4_ = -1;
  }
  else if (bVar1) {
    memset(sin.sin_zero,0,0x1c);
    sin.sin_zero[0] = '\n';
    sin.sin_zero[1] = '\0';
    sin.sin_zero._2_2_ = htons((uint16_t)local_2c);
    iVar2 = evutil_inet_pton(10,port_part,&sin6);
    if (iVar2 == 1) {
      if (*outlen < 0x1c) {
        ip_as_string_local._4_4_ = -1;
      }
      else {
        memset(out,0,(long)*outlen);
        out->sa_family = sin.sin_zero._0_2_;
        out->sa_data[0] = sin.sin_zero[2];
        out->sa_data[1] = sin.sin_zero[3];
        out->sa_data[2] = sin.sin_zero[4];
        out->sa_data[3] = sin.sin_zero[5];
        out->sa_data[4] = sin.sin_zero[6];
        out->sa_data[5] = sin.sin_zero[7];
        *(undefined8 *)(out->sa_data + 6) = sin6._0_8_;
        out[1].sa_family = sin6.sin6_addr.__in6_u._0_2_;
        out[1].sa_data[0] = sin6.sin6_addr.__in6_u._2_1_;
        out[1].sa_data[1] = sin6.sin6_addr.__in6_u._3_1_;
        out[1].sa_data[2] = sin6.sin6_addr.__in6_u._4_1_;
        out[1].sa_data[3] = sin6.sin6_addr.__in6_u._5_1_;
        out[1].sa_data[4] = sin6.sin6_addr.__in6_u._6_1_;
        out[1].sa_data[5] = sin6.sin6_addr.__in6_u._7_1_;
        *(uint32_t *)(out[1].sa_data + 6) = sin6.sin6_addr.__in6_u.__u6_addr32[2];
        *outlen = 0x1c;
        ip_as_string_local._4_4_ = 0;
      }
    }
    else {
      ip_as_string_local._4_4_ = -1;
    }
  }
  else {
    memset(&local_10c,0,0x10);
    local_10c = 2;
    uStack_10a = htons((uint16_t)local_2c);
    iVar2 = evutil_inet_pton(2,port_part,&uStack_108);
    if (iVar2 == 1) {
      if (*outlen < 0x10) {
        ip_as_string_local._4_4_ = -1;
      }
      else {
        memset(out,0,(long)*outlen);
        out->sa_family = local_10c;
        out->sa_data[0] = (char)uStack_10a;
        out->sa_data[1] = (char)(uStack_10a >> 8);
        out->sa_data[2] = (char)uStack_108;
        out->sa_data[3] = (char)((uint)uStack_108 >> 8);
        out->sa_data[4] = (char)((uint)uStack_108 >> 0x10);
        out->sa_data[5] = (char)((uint)uStack_108 >> 0x18);
        *(undefined8 *)(out->sa_data + 6) = sin._0_8_;
        *outlen = 0x10;
        ip_as_string_local._4_4_ = 0;
      }
    }
    else {
      ip_as_string_local._4_4_ = -1;
    }
  }
  return ip_as_string_local._4_4_;
}

Assistant:

int
evutil_parse_sockaddr_port(const char *ip_as_string, struct sockaddr *out, int *outlen)
{
	int port;
	char buf[128];
	const char *cp, *addr_part, *port_part;
	int is_ipv6;
	/* recognized formats are:
	 * [ipv6]:port
	 * ipv6
	 * [ipv6]
	 * ipv4:port
	 * ipv4
	 */

	cp = strchr(ip_as_string, ':');
	if (*ip_as_string == '[') {
		size_t len;
		if (!(cp = strchr(ip_as_string, ']'))) {
			return -1;
		}
		len = ( cp-(ip_as_string + 1) );
		if (len > sizeof(buf)-1) {
			return -1;
		}
		memcpy(buf, ip_as_string+1, len);
		buf[len] = '\0';
		addr_part = buf;
		if (cp[1] == ':')
			port_part = cp+2;
		else
			port_part = NULL;
		is_ipv6 = 1;
	} else if (cp && strchr(cp+1, ':')) {
		is_ipv6 = 1;
		addr_part = ip_as_string;
		port_part = NULL;
	} else if (cp) {
		is_ipv6 = 0;
		if (cp - ip_as_string > (int)sizeof(buf)-1) {
			return -1;
		}
		memcpy(buf, ip_as_string, cp-ip_as_string);
		buf[cp-ip_as_string] = '\0';
		addr_part = buf;
		port_part = cp+1;
	} else {
		addr_part = ip_as_string;
		port_part = NULL;
		is_ipv6 = 0;
	}

	if (port_part == NULL) {
		port = 0;
	} else {
		port = atoi(port_part);
		if (port <= 0 || port > 65535) {
			return -1;
		}
	}

	if (!addr_part)
		return -1; /* Should be impossible. */
#ifdef AF_INET6
	if (is_ipv6)
	{
		struct sockaddr_in6 sin6;
		memset(&sin6, 0, sizeof(sin6));
#ifdef EVENT__HAVE_STRUCT_SOCKADDR_IN6_SIN6_LEN
		sin6.sin6_len = sizeof(sin6);
#endif
		sin6.sin6_family = AF_INET6;
		sin6.sin6_port = htons(port);
		if (1 != evutil_inet_pton(AF_INET6, addr_part, &sin6.sin6_addr))
			return -1;
		if ((int)sizeof(sin6) > *outlen)
			return -1;
		memset(out, 0, *outlen);
		memcpy(out, &sin6, sizeof(sin6));
		*outlen = sizeof(sin6);
		return 0;
	}
	else
#endif
	{
		struct sockaddr_in sin;
		memset(&sin, 0, sizeof(sin));
#ifdef EVENT__HAVE_STRUCT_SOCKADDR_IN_SIN_LEN
		sin.sin_len = sizeof(sin);
#endif
		sin.sin_family = AF_INET;
		sin.sin_port = htons(port);
		if (1 != evutil_inet_pton(AF_INET, addr_part, &sin.sin_addr))
			return -1;
		if ((int)sizeof(sin) > *outlen)
			return -1;
		memset(out, 0, *outlen);
		memcpy(out, &sin, sizeof(sin));
		*outlen = sizeof(sin);
		return 0;
	}
}